

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_child_block
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  BlockOrRecord *pBVar1;
  bool bVar2;
  BlockOrRecord *pBVar3;
  bool bVar4;
  
  if (entry->id == 0x10) {
    pBVar3 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pBVar3 == pBVar1;
    if (bVar4) {
      return true;
    }
    bVar2 = parse_metadata_attachment_record(this,pBVar3);
    if (bVar2) {
      do {
        pBVar3 = pBVar3 + 1;
        bVar4 = pBVar3 == pBVar1;
        if (bVar4) {
          return true;
        }
        bVar2 = parse_metadata_attachment_record(this,pBVar3);
      } while (bVar2);
    }
  }
  else {
    if (entry->id != 0xb) {
      return true;
    }
    pBVar3 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pBVar3 == pBVar1;
    if (bVar4) {
      return true;
    }
    bVar2 = parse_constants_record(this,pBVar3);
    if (bVar2) {
      do {
        pBVar3 = pBVar3 + 1;
        bVar4 = pBVar3 == pBVar1;
        if (bVar4) {
          return true;
        }
        bVar2 = parse_constants_record(this,pBVar3);
      } while (bVar2);
    }
  }
  if (bVar4) {
    return true;
  }
  return false;
}

Assistant:

bool ModuleParseContext::parse_function_child_block(const BlockOrRecord &entry)
{
	switch (KnownBlocks(entry.id))
	{
	case KnownBlocks::CONSTANTS_BLOCK:
	{
		for (auto &child : entry.children)
			if (!parse_constants_record(child))
				return false;
		break;
	}

	case KnownBlocks::METADATA_ATTACHMENT:
	{
		for (auto &child : entry.children)
			if (!parse_metadata_attachment_record(child))
				return false;
		break;
	}

	default:
		break;
	}

	return true;
}